

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

char * getSelectionString(Atom selection)

{
  int iVar1;
  Window WVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  size_t size;
  bool bVar7;
  char *data;
  unsigned_long itemCount;
  int actualFormat;
  long local_1f8;
  Atom local_1f0;
  Atom local_1e8;
  Atom actualType;
  long local_1d8;
  unsigned_long bytesAfter;
  Atom targets [2];
  XEvent notification;
  XEvent dummy;
  
  targets[0] = _glfw.x11.UTF8_STRING;
  targets[1] = 0x1f;
  bVar7 = _glfw.x11.PRIMARY != selection;
  WVar2 = (*_glfw.x11.xlib.GetSelectionOwner)(_glfw.x11.display,selection);
  pcVar3 = *(char **)((long)_glfw.x11.keynames + (ulong)bVar7 * 8 + -0x10);
  if (WVar2 != _glfw.x11.helperWindowHandle) {
    lVar5 = (ulong)bVar7 * 8;
    lVar6 = lVar5 + 0x20a48;
    _glfw_free(pcVar3);
    *(undefined8 *)((long)_glfw.x11.keynames + lVar5 + -0x10) = 0;
    lVar5 = 0;
    local_1f8 = lVar6;
    local_1f0 = selection;
    while (lVar5 != 2) {
      local_1e8 = targets[lVar5];
      local_1d8 = lVar5;
      (*_glfw.x11.xlib.ConvertSelection)
                (_glfw.x11.display,selection,local_1e8,_glfw.x11.GLFW_SELECTION,
                 _glfw.x11.helperWindowHandle,0);
      while (iVar1 = (*_glfw.x11.xlib.CheckTypedWindowEvent)
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,&notification),
            iVar1 == 0) {
        waitForEvent((double *)0x0);
      }
      if (notification.xkey.time != 0) {
        (*_glfw.x11.xlib.CheckIfEvent)
                  (_glfw.x11.display,&dummy,isSelPropNewValueNotify,(XPointer)&notification);
        (*_glfw.x11.xlib.GetWindowProperty)
                  (_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                   0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,&bytesAfter,
                   (uchar **)&data);
        if (actualType == _glfw.x11.INCR) {
          size = 1;
          pcVar3 = (char *)0x0;
          do {
            while (iVar1 = (*_glfw.x11.xlib.CheckIfEvent)
                                     (_glfw.x11.display,&dummy,isSelPropNewValueNotify,
                                      (XPointer)&notification), iVar1 == 0) {
              waitForEvent((double *)0x0);
            }
            (*_glfw.x11.xlib.Free)(data);
            (*_glfw.x11.xlib.GetWindowProperty)
                      (_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                       0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,&bytesAfter,
                       (uchar **)&data);
            if (itemCount == 0) break;
            size = size + itemCount;
            pcVar3 = (char *)_glfw_realloc(pcVar3,size);
            pcVar3[~itemCount + size] = '\0';
            strcat(pcVar3,data);
          } while (itemCount != 0);
          if (local_1e8 == 0x1f) {
            pcVar4 = convertLatin1toUTF8(pcVar3);
            lVar6 = local_1f8;
            *(char **)((long)&_glfw.initialized + local_1f8) = pcVar4;
            _glfw_free(pcVar3);
            selection = local_1f0;
          }
          else {
            *(char **)((long)&_glfw.initialized + local_1f8) = pcVar3;
            lVar6 = local_1f8;
            selection = local_1f0;
          }
        }
        else if (actualType == local_1e8) {
          if (local_1e8 == 0x1f) {
            pcVar3 = convertLatin1toUTF8(data);
          }
          else {
            pcVar3 = _glfw_strdup(data);
          }
          *(char **)((long)&_glfw.initialized + lVar6) = pcVar3;
        }
        (*_glfw.x11.xlib.Free)(data);
        pcVar3 = *(char **)((long)&_glfw.initialized + lVar6);
        if (pcVar3 != (char *)0x0) {
          return pcVar3;
        }
      }
      lVar5 = local_1d8 + 1;
    }
    pcVar3 = *(char **)((long)&_glfw.initialized + lVar6);
    if (pcVar3 == (char *)0x0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
      pcVar3 = *(char **)((long)&_glfw.initialized + lVar6);
    }
  }
  return pcVar3;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    _glfw_free(*selectionString);
    *selectionString = NULL;

    for (size_t i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = _glfw_realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        _glfw_free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}